

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::custom_op<unsigned_short>::mpi_user_function(void *in,void *inout,int *n,MPI_Datatype *dt)

{
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *__x;
  int local_4c;
  undefined1 local_48 [8];
  func_t f;
  MPI_Datatype *dt_local;
  int *n_local;
  void *inout_local;
  void *in_local;
  
  local_4c = 0x543;
  f._M_invoker = (_Invoker_type)dt;
  __x = attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::get
                  (dt,&local_4c);
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::function
            ((function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)local_48,__x);
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::operator()
            ((function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)local_48,in,inout,n,
             (ompi_datatype_t **)f._M_invoker);
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::~function
            ((function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)local_48);
  return;
}

Assistant:

static void mpi_user_function(void* in, void* inout, int* n, MPI_Datatype* dt) {
        // get the std::function from the MPI_Datatype and call it
        func_t f = attr_map<int, func_t>::get(*dt, 1347);
        f(in, inout, n, dt);
    }